

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::JavascriptArray::Unshift<Js::JavascriptArray::BigIndex,unsigned_int>
               (RecyclableObject *obj,BigIndex *toIndex,uint start,uint end,
               ScriptContext *scriptContext)

{
  BOOL BVar1;
  ThreadContext *threadContext;
  Var newValue;
  BigIndex BVar2;
  Var element;
  BOOL hasItem;
  uint i;
  BigIndex dst;
  BigIndex newEnd;
  ThrowTypeErrorOnFailureHelper h;
  undefined1 local_48 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext_local;
  uint end_local;
  uint start_local;
  BigIndex *toIndex_local;
  RecyclableObject *obj_local;
  
  jsReentLock._24_8_ = scriptContext;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_48,threadContext);
  JsReentLock::setObjectForMutation((JsReentLock *)local_48,obj);
  ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailureHelper
            ((ThrowTypeErrorOnFailureHelper *)&newEnd.bigIndex,(ScriptContext *)jsReentLock._24_8_,
             L"Array.prototype.unshift");
  if (start < end) {
    BigIndex::BigIndex((BigIndex *)&dst.bigIndex,~start + end);
    BVar2 = BigIndex::operator+(toIndex,(BigIndex *)&dst.bigIndex);
    dst._0_8_ = BVar2.bigIndex;
    hasItem = BVar2.index;
    for (element._4_4_ = end; start < element._4_4_; element._4_4_ = element._4_4_ - 1) {
      JsReentLock::unlock((JsReentLock *)local_48);
      BVar1 = Js::JavascriptOperators::HasItem(obj,element._4_4_ - 1);
      JsReentLock::MutateArrayObject((JsReentLock *)local_48);
      JsReentLock::relock((JsReentLock *)local_48);
      if (BVar1 == 0) {
        JsReentLock::unlock((JsReentLock *)local_48);
        BVar1 = IndexTrace<Js::JavascriptArray::BigIndex>::DeleteItem
                          (obj,(BigIndex *)&hasItem,PropertyOperation_ThrowOnDeleteIfNotConfig);
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)&newEnd.bigIndex,BVar1);
        JsReentLock::MutateArrayObject((JsReentLock *)local_48);
        JsReentLock::relock((JsReentLock *)local_48);
      }
      else {
        JsReentLock::unlock((JsReentLock *)local_48);
        newValue = Js::JavascriptOperators::GetItem
                             (obj,element._4_4_ - 1,(ScriptContext *)jsReentLock._24_8_);
        BVar1 = IndexTrace<Js::JavascriptArray::BigIndex>::SetItem
                          (obj,(BigIndex *)&hasItem,newValue,PropertyOperation_ThrowIfNotExtensible)
        ;
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)&newEnd.bigIndex,BVar1);
        JsReentLock::MutateArrayObject((JsReentLock *)local_48);
        JsReentLock::relock((JsReentLock *)local_48);
      }
      BigIndex::operator--((BigIndex *)&hasItem);
    }
  }
  JsReentLock::~JsReentLock((JsReentLock *)local_48);
  return;
}

Assistant:

void JavascriptArray::Unshift(RecyclableObject* obj, const T& toIndex, P start, P end, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        typedef IndexTrace<T> index_trace;

        ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.unshift"));
        if (start < end)
        {
            T newEnd = (end - start - 1);// newEnd - 1
            T dst = toIndex + newEnd;
            for (P i = end; i > start; --i)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, i - 1));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(obj, i - 1, scriptContext),
                        h.ThrowTypeErrorOnFailure(index_trace::SetItem(obj, dst, element, PropertyOperation_ThrowIfNotExtensible)));
                }
                else
                {
                    JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(index_trace::DeleteItem(obj, dst, PropertyOperation_ThrowOnDeleteIfNotConfig)));
                }

                --dst;
            }
        }
    }